

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int mv_err_cost(MV *mv,MV *ref_mv,int *mvjcost,int **mvcost,int error_per_bit,
               MV_COST_TYPE mv_cost_type)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  long in_RCX;
  short *in_RSI;
  short *in_RDI;
  int in_R8D;
  byte in_R9B;
  MV abs_diff;
  MV diff;
  undefined2 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd2;
  int local_4;
  
  sVar1 = *in_RDI - *in_RSI;
  sVar2 = in_RDI[1] - in_RSI[1];
  sVar3 = sVar1;
  if (sVar1 < 1) {
    sVar3 = -sVar1;
  }
  sVar4 = sVar2;
  if (sVar2 < 1) {
    sVar4 = -sVar2;
  }
  switch((int **)(ulong)in_R9B) {
  case (int **)0x0:
    if (in_RCX == 0) {
      local_4 = 0;
    }
    else {
      iVar5 = mv_cost((MV *)CONCAT44(in_R8D,CONCAT13(in_R9B,CONCAT12(in_stack_ffffffffffffffd2,sVar2
                                                                    ))),
                      (int *)CONCAT26(sVar1,CONCAT24(sVar4,CONCAT22(sVar3,in_stack_ffffffffffffffc8)
                                                    )),(int **)(ulong)in_R9B);
      local_4 = (int)((long)iVar5 * (long)in_R8D + 0x2000 >> 0xe);
    }
    break;
  case (int **)0x1:
    local_4 = ((int)sVar3 + (int)sVar4) * 2 >> 3;
    break;
  case (int **)0x2:
    local_4 = 0;
    break;
  case (int **)0x3:
    local_4 = (int)sVar3 + (int)sVar4 >> 3;
    break;
  case (int **)0x4:
    local_4 = 0;
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int mv_err_cost(const MV *mv, const MV *ref_mv,
                              const int *mvjcost, const int *const mvcost[2],
                              int error_per_bit, MV_COST_TYPE mv_cost_type) {
  const MV diff = { mv->row - ref_mv->row, mv->col - ref_mv->col };
  const MV abs_diff = { abs(diff.row), abs(diff.col) };

  switch (mv_cost_type) {
    case MV_COST_ENTROPY:
      if (mvcost) {
        return (int)ROUND_POWER_OF_TWO_64(
            (int64_t)mv_cost(&diff, mvjcost, mvcost) * error_per_bit,
            RDDIV_BITS + AV1_PROB_COST_SHIFT - RD_EPB_SHIFT +
                PIXEL_TRANSFORM_ERROR_SCALE);
      }
      return 0;
    case MV_COST_L1_LOWRES:
      return (SSE_LAMBDA_LOWRES * (abs_diff.row + abs_diff.col)) >> 3;
    case MV_COST_L1_MIDRES:
      return (SSE_LAMBDA_MIDRES * (abs_diff.row + abs_diff.col)) >> 3;
    case MV_COST_L1_HDRES:
      return (SSE_LAMBDA_HDRES * (abs_diff.row + abs_diff.col)) >> 3;
    case MV_COST_NONE: return 0;
    default: assert(0 && "Invalid rd_cost_type"); return 0;
  }
}